

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-optimizer-common.hpp
# Opt level: O0

result * __thiscall
baryonyx::itm::
optimize_problem<baryonyx::itm::solver_equalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>,long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>>
          (result *__return_storage_ptr__,itm *this,context *ctx,problem *pb)

{
  allocator<std::thread> *this_00;
  double dVar1;
  bool bVar2;
  uint thread_number;
  int iVar3;
  result_type_conflict __s;
  type __args_2;
  reference pvVar4;
  reference this_01;
  raw_result<baryonyx::itm::minimize_tag> *prVar5;
  reference pvVar6;
  int local_254;
  int i_3;
  raw_result<baryonyx::itm::minimize_tag> *first;
  thread *t;
  iterator __end2;
  iterator __begin2;
  vector<std::thread,_std::allocator<std::thread>_> *__range2;
  double local_210;
  double duration;
  double value;
  long loop;
  int constraints_remaining;
  uint i_2;
  long call_number;
  duration<long,_std::ratio<1L,_1L>_> local_1e0;
  duration local_1d8;
  time_point end;
  time_point start;
  reference_wrapper<const_std::vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>_>
  local_1c0;
  reference_wrapper<baryonyx::itm::best_solution_recorder<baryonyx::itm::default_cost_type<long_double>,_long_double,_baryonyx::itm::minimize_tag>_>
  local_1b8;
  reference_wrapper<std::atomic<bool>_> local_1b0;
  reference_wrapper<baryonyx::itm::optimize_functor<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>,_long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>_>_>
  local_1a8;
  thread local_1a0;
  uint local_194;
  uint local_190;
  uint i_1;
  uint i;
  atomic_bool stop_task;
  unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_> seeds;
  best_solution_recorder<baryonyx::itm::default_cost_type<long_double>,_long_double,_baryonyx::itm::minimize_tag>
  best_recorder;
  undefined1 local_b8 [8];
  vector<std::thread,_std::allocator<std::thread>_> pool;
  vector<baryonyx::itm::optimize_functor<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>,_long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>_>,_std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>,_long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>_>_>_>
  functors;
  double dStack_80;
  uint thread;
  double cost_constant;
  default_cost_type<long_double> cost;
  int variables;
  random_engine rng;
  undefined1 local_50 [8];
  vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  constraints;
  problem *pb_local;
  context *ctx_local;
  result *r;
  
  baryonyx::result::result(__return_storage_ptr__);
  bVar2 = std::function::operator_cast_to_bool((function *)(this + 0x118));
  if (bVar2) {
    std::function<void_(const_baryonyx::solver_parameters_&)>::operator()
              ((function<void_(const_baryonyx::solver_parameters_&)> *)(this + 0x118),
               (solver_parameters *)this);
  }
  make_merged_constraints
            ((vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
              *)local_50,(context *)this,(problem *)ctx);
  bVar2 = std::
          vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
          ::empty((vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                   *)local_50);
  if ((bVar2) ||
     (bVar2 = std::vector<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>::
              empty((vector<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_> *)
                    &(ctx->parameters).seed), bVar2)) {
    __return_storage_ptr__->status = success;
    std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize
              (&__return_storage_ptr__->solutions,1);
    dVar1 = (ctx->parameters).pushing_objective_amplifier;
    pvVar6 = std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::back
                       (&__return_storage_ptr__->solutions);
    pvVar6->value = dVar1;
    std::shared_ptr<baryonyx::string_buffer>::operator=
              (&__return_storage_ptr__->strings,(shared_ptr<baryonyx::string_buffer> *)ctx);
    affected_variables::operator=
              (&__return_storage_ptr__->affected_vars,
               (affected_variables *)&(ctx->parameters).pushing_iteration_limit);
    std::
    vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::operator=(&__return_storage_ptr__->variable_name,
                (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 *)&(ctx->parameters).init_kappa_improve_increase);
    rng._M_x._4_4_ = 1;
  }
  else {
    __s = init_random_generator_seed((context *)this);
    std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
    linear_congruential_engine
              ((linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
               &stack0xffffffffffffffa0,__s);
    cost.linear_elements._M_t.
    super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
    super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
    super__Head_base<0UL,_long_double_*,_false>._M_head_impl._4_4_ =
         length<std::vector<baryonyx::variable_value,std::allocator<baryonyx::variable_value>>>
                   ((vector<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_> *)
                    &(ctx->parameters).seed);
    default_cost_type<long_double>::default_cost_type
              ((default_cost_type<long_double> *)&cost_constant,
               (objective_function *)&(ctx->parameters).delta,
               cost.linear_elements._M_t.
               super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
               super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
               super__Head_base<0UL,_long_double_*,_false>._M_head_impl._4_4_);
    dStack_80 = (ctx->parameters).pushing_objective_amplifier;
    thread_number = get_thread_number((context *)this);
    std::
    vector<baryonyx::itm::optimize_functor<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>,_long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>_>,_std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>,_long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>_>_>_>
    ::vector((vector<baryonyx::itm::optimize_functor<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>,_long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>_>,_std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>,_long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>_>_>_>
              *)&pool.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage);
    this_00 = (allocator<std::thread> *)
              ((long)&best_recorder.m_kappa_append.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<std::thread>::allocator(this_00);
    std::vector<std::thread,_std::allocator<std::thread>_>::vector
              ((vector<std::thread,_std::allocator<std::thread>_> *)local_b8,(ulong)thread_number,
               this_00);
    std::allocator<std::thread>::~allocator
              ((allocator<std::thread> *)
               ((long)&best_recorder.m_kappa_append.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    best_solution_recorder<baryonyx::itm::default_cost_type<long_double>,_long_double,_baryonyx::itm::minimize_tag>
    ::best_solution_recorder
              ((best_solution_recorder<baryonyx::itm::default_cost_type<long_double>,_long_double,_baryonyx::itm::minimize_tag>
                *)&seeds,(random_engine *)&stack0xffffffffffffffa0,thread_number,
               (default_cost_type<long_double> *)&cost_constant,dStack_80,
               cost.linear_elements._M_t.
               super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
               super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
               super__Head_base<0UL,_long_double_*,_false>._M_head_impl._4_4_,
               (vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                *)local_50,*(int *)(this + 0xc4));
    generate_seed((itm *)&i,(random_engine *)&stack0xffffffffffffffa0,thread_number);
    std::atomic<bool>::atomic((atomic<bool> *)((long)&i_1 + 3));
    std::atomic<bool>::store((atomic<bool> *)((long)&i_1 + 3),false,seq_cst);
    for (local_190 = 0; local_190 != thread_number; local_190 = local_190 + 1) {
      __args_2 = std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::operator[]
                           ((unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_> *)&i
                            ,(ulong)local_190);
      std::
      vector<baryonyx::itm::optimize_functor<baryonyx::itm::solver_equalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>,long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>>,std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_equalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>,long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>>>>
      ::emplace_back<baryonyx::context_const&,unsigned_int&,unsigned_long&>
                ((vector<baryonyx::itm::optimize_functor<baryonyx::itm::solver_equalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>,long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>>,std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_equalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>,long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>>>>
                  *)&pool.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,(context *)this,&local_190,__args_2);
    }
    for (local_194 = 0; local_194 != thread_number; local_194 = local_194 + 1) {
      pvVar4 = std::
               vector<baryonyx::itm::optimize_functor<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>,_long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>_>,_std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>,_long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>_>_>_>
               ::operator[]((vector<baryonyx::itm::optimize_functor<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>,_long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>_>,_std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>,_long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>_>_>_>
                             *)&pool.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_194);
      local_1a8 = std::
                  ref<baryonyx::itm::optimize_functor<baryonyx::itm::solver_equalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>,long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>>>
                            (pvVar4);
      local_1b0 = std::ref<std::atomic<bool>>((atomic<bool> *)((long)&i_1 + 3));
      local_1b8 = std::
                  ref<baryonyx::itm::best_solution_recorder<baryonyx::itm::default_cost_type<long_double>,long_double,baryonyx::itm::minimize_tag>>
                            ((best_solution_recorder<baryonyx::itm::default_cost_type<long_double>,_long_double,_baryonyx::itm::minimize_tag>
                              *)&seeds);
      local_1c0 = std::
                  cref<std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>>
                            ((vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                              *)local_50);
      start.__d.__r =
           (duration)
           std::cref<baryonyx::itm::default_cost_type<long_double>>
                     ((default_cost_type<long_double> *)&cost_constant);
      std::thread::
      thread<std::reference_wrapper<baryonyx::itm::optimize_functor<baryonyx::itm::solver_equalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>,long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>>>,std::reference_wrapper<std::atomic<bool>>,std::reference_wrapper<baryonyx::itm::best_solution_recorder<baryonyx::itm::default_cost_type<long_double>,long_double,baryonyx::itm::minimize_tag>>,std::reference_wrapper<std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const>,int&,std::reference_wrapper<baryonyx::itm::default_cost_type<long_double>const>,double&,void>
                (&local_1a0,&local_1a8,&local_1b0,&local_1b8,&local_1c0,
                 (int *)((long)&cost.linear_elements._M_t.
                                super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>
                                .super__Head_base<0UL,_long_double_*,_false> + 4),
                 (reference_wrapper<const_baryonyx::itm::default_cost_type<long_double>_> *)&start,
                 &stack0xffffffffffffff80);
      this_01 = std::vector<std::thread,_std::allocator<std::thread>_>::operator[]
                          ((vector<std::thread,_std::allocator<std::thread>_> *)local_b8,
                           (ulong)local_194);
      std::thread::operator=(this_01,&local_1a0);
      std::thread::~thread(&local_1a0);
    }
    local_1d8.__r = std::chrono::_V2::steady_clock::now();
    end.__d.__r = (duration)(duration)local_1d8.__r;
    do {
      call_number = 1;
      std::chrono::duration<long,std::ratio<1l,1l>>::duration<long,void>
                ((duration<long,std::ratio<1l,1l>> *)&local_1e0,&call_number);
      std::this_thread::sleep_for<long,std::ratio<1l,1l>>(&local_1e0);
      bVar2 = std::function::operator_cast_to_bool((function *)(this + 0x138));
      if (bVar2) {
        _constraints_remaining = 0;
        for (loop._4_4_ = 0; loop._4_4_ != thread_number; loop._4_4_ = loop._4_4_ + 1) {
          pvVar4 = std::
                   vector<baryonyx::itm::optimize_functor<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>,_long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>_>,_std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>,_long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>_>_>_>
                   ::operator[]((vector<baryonyx::itm::optimize_functor<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>,_long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>_>,_std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>,_long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>_>_>_>
                                 *)&pool.
                                    super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage,
                                (ulong)loop._4_4_);
          _constraints_remaining = pvVar4->m_call_number + _constraints_remaining;
        }
        best_solution_recorder<baryonyx::itm::default_cost_type<long_double>,_long_double,_baryonyx::itm::minimize_tag>
        ::get_best((best_solution_recorder<baryonyx::itm::default_cost_type<long_double>,_long_double,_baryonyx::itm::minimize_tag>
                    *)&seeds,(int *)&loop,&duration,&local_210,(long *)&value);
        std::function<void_(int,_double,_long,_double,_long)>::operator()
                  ((function<void_(int,_double,_long,_double,_long)> *)(this + 0x138),(int)loop,
                   duration,(long)value,local_210,_constraints_remaining);
      }
      local_1d8.__r = std::chrono::_V2::steady_clock::now();
      bVar2 = is_time_limit(*(double *)this,end,(time_point)local_1d8.__r);
    } while (((bVar2 ^ 0xffU) & 1) != 0);
    std::atomic<bool>::store((atomic<bool> *)((long)&i_1 + 3),true,seq_cst);
    __end2 = std::vector<std::thread,_std::allocator<std::thread>_>::begin
                       ((vector<std::thread,_std::allocator<std::thread>_> *)local_b8);
    t = (thread *)
        std::vector<std::thread,_std::allocator<std::thread>_>::end
                  ((vector<std::thread,_std::allocator<std::thread>_> *)local_b8);
    while (bVar2 = __gnu_cxx::
                   operator==<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                             (&__end2,(__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                                       *)&t), ((bVar2 ^ 0xffU) & 1) != 0) {
      __gnu_cxx::
      __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
      operator*(&__end2);
      std::thread::join();
      __gnu_cxx::
      __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
      operator++(&__end2);
    }
    std::shared_ptr<baryonyx::string_buffer>::operator=
              (&__return_storage_ptr__->strings,(shared_ptr<baryonyx::string_buffer> *)ctx);
    affected_variables::operator=
              (&__return_storage_ptr__->affected_vars,
               (affected_variables *)&(ctx->parameters).pushing_iteration_limit);
    std::
    vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::operator=(&__return_storage_ptr__->variable_name,
                (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 *)&(ctx->parameters).init_kappa_improve_increase);
    __return_storage_ptr__->variables =
         cost.linear_elements._M_t.
         super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
         super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
         super__Head_base<0UL,_long_double_*,_false>._M_head_impl._4_4_;
    iVar3 = length<std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>>
                      ((vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                        *)local_50);
    __return_storage_ptr__->constraints = iVar3;
    prVar5 = best_solution_recorder<baryonyx::itm::default_cost_type<long_double>,_long_double,_baryonyx::itm::minimize_tag>
             ::get_best((best_solution_recorder<baryonyx::itm::default_cost_type<long_double>,_long_double,_baryonyx::itm::minimize_tag>
                         *)&seeds,0);
    bVar2 = raw_result<baryonyx::itm::minimize_tag>::is_solution(prVar5);
    if (bVar2) {
      __return_storage_ptr__->status = success;
    }
    else {
      __return_storage_ptr__->status = time_limit_reached;
    }
    __return_storage_ptr__->duration = prVar5->duration;
    __return_storage_ptr__->loop = prVar5->loop;
    __return_storage_ptr__->remaining_constraints = prVar5->remaining_constraints;
    iVar3 = *(int *)(this + 0xe8);
    if (iVar3 == 0) {
      std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize
                (&__return_storage_ptr__->solutions,1);
      pvVar6 = std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::operator[]
                         (&__return_storage_ptr__->solutions,0);
      convert<baryonyx::itm::minimize_tag>
                (prVar5,pvVar6,
                 cost.linear_elements._M_t.
                 super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
                 super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
                 super__Head_base<0UL,_long_double_*,_false>._M_head_impl._4_4_);
    }
    else if (iVar3 == 1) {
      std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize
                (&__return_storage_ptr__->solutions,2);
      pvVar6 = std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::operator[]
                         (&__return_storage_ptr__->solutions,0);
      convert<baryonyx::itm::minimize_tag>
                (prVar5,pvVar6,
                 cost.linear_elements._M_t.
                 super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
                 super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
                 super__Head_base<0UL,_long_double_*,_false>._M_head_impl._4_4_);
      prVar5 = best_solution_recorder<baryonyx::itm::default_cost_type<long_double>,_long_double,_baryonyx::itm::minimize_tag>
               ::get_worst((best_solution_recorder<baryonyx::itm::default_cost_type<long_double>,_long_double,_baryonyx::itm::minimize_tag>
                            *)&seeds);
      pvVar6 = std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::operator[]
                         (&__return_storage_ptr__->solutions,1);
      convert<baryonyx::itm::minimize_tag>
                (prVar5,pvVar6,
                 cost.linear_elements._M_t.
                 super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
                 super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
                 super__Head_base<0UL,_long_double_*,_false>._M_head_impl._4_4_);
    }
    else if (iVar3 == 2) {
      std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize
                (&__return_storage_ptr__->solutions,5);
      for (local_254 = 0; local_254 != 5; local_254 = local_254 + 1) {
        prVar5 = best_solution_recorder<baryonyx::itm::default_cost_type<long_double>,_long_double,_baryonyx::itm::minimize_tag>
                 ::get_best((best_solution_recorder<baryonyx::itm::default_cost_type<long_double>,_long_double,_baryonyx::itm::minimize_tag>
                             *)&seeds,local_254);
        pvVar6 = std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::operator[]
                           (&__return_storage_ptr__->solutions,(long)local_254);
        convert<baryonyx::itm::minimize_tag>
                  (prVar5,pvVar6,
                   cost.linear_elements._M_t.
                   super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
                   super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
                   super__Head_base<0UL,_long_double_*,_false>._M_head_impl._4_4_);
      }
    }
    best_solution_recorder<baryonyx::itm::default_cost_type<long_double>,_long_double,_baryonyx::itm::minimize_tag>
    ::show_population((best_solution_recorder<baryonyx::itm::default_cost_type<long_double>,_long_double,_baryonyx::itm::minimize_tag>
                       *)&seeds,(context *)this);
    bVar2 = std::function::operator_cast_to_bool((function *)(this + 0x158));
    if (bVar2) {
      std::function<void_(const_baryonyx::result_&)>::operator()
                ((function<void_(const_baryonyx::result_&)> *)(this + 0x158),__return_storage_ptr__)
      ;
    }
    rng._M_x._4_4_ = 1;
    std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::~unique_ptr
              ((unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_> *)&i);
    best_solution_recorder<baryonyx::itm::default_cost_type<long_double>,_long_double,_baryonyx::itm::minimize_tag>
    ::~best_solution_recorder
              ((best_solution_recorder<baryonyx::itm::default_cost_type<long_double>,_long_double,_baryonyx::itm::minimize_tag>
                *)&seeds);
    std::vector<std::thread,_std::allocator<std::thread>_>::~vector
              ((vector<std::thread,_std::allocator<std::thread>_> *)local_b8);
    std::
    vector<baryonyx::itm::optimize_functor<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>,_long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>_>,_std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>,_long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>_>_>_>
    ::~vector((vector<baryonyx::itm::optimize_functor<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>,_long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>_>,_std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>,_long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>_>_>_>
               *)&pool.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    default_cost_type<long_double>::~default_cost_type
              ((default_cost_type<long_double> *)&cost_constant);
  }
  std::vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>::
  ~vector((vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
           *)local_50);
  return __return_storage_ptr__;
}

Assistant:

inline result
optimize_problem(const context& ctx, const problem& pb)
{
    result r;

    if (ctx.start)
        ctx.start(ctx.parameters);

    auto constraints{ make_merged_constraints(ctx, pb) };
    if (constraints.empty() || pb.vars.values.empty()) {
        r.status = result_status::success;
        r.solutions.resize(1);
        r.solutions.back().value = pb.objective.value;
        r.strings = pb.strings;
        r.affected_vars = pb.affected_vars;
        r.variable_name = pb.vars.names;
        return r;
    }

    random_engine rng(init_random_generator_seed(ctx));

    auto variables = length(pb.vars.values);
    auto cost = Cost(pb.objective, variables);
    auto cost_constant = pb.objective.value;

    const auto thread = get_thread_number(ctx);

    std::vector<optimize_functor<Solver, Float, Mode, Cost>> functors;
    std::vector<std::thread> pool(thread);

    best_solution_recorder<Cost, Float, Mode> best_recorder(
      rng,
      thread,
      cost,
      cost_constant,
      variables,
      constraints,
      ctx.parameters.init_population_size);

    auto seeds = generate_seed(rng, thread);

    std::atomic_bool stop_task;
    stop_task.store(false);

    for (unsigned i = 0u; i != thread; ++i)
        functors.emplace_back(ctx, i, seeds[i]);

    for (unsigned i = 0u; i != thread; ++i)
        pool[i] = std::thread(std::ref(functors[i]),
                              std::ref(stop_task),
                              std::ref(best_recorder),
                              std::cref(constraints),
                              variables,
                              std::cref(cost),
                              cost_constant);

    const auto start = std::chrono::steady_clock::now();
    auto end = start;

    do {
        std::this_thread::sleep_for(std::chrono::seconds{ 1L });

        if (ctx.update) {
            auto call_number = 0L;
            for (auto i = 0u; i != thread; ++i)
                call_number += functors[i].m_call_number;

            int constraints_remaining;
            long int loop;
            double value;
            double duration;

            best_recorder.get_best(
              constraints_remaining, value, duration, loop);

            ctx.update(
              constraints_remaining, value, loop, duration, call_number);
        }

        end = std::chrono::steady_clock::now();
    } while (!is_time_limit(ctx.parameters.time_limit, start, end));

    stop_task.store(true);

    for (auto& t : pool)
        t.join();

    r.strings = pb.strings;
    r.affected_vars = pb.affected_vars;
    r.variable_name = pb.vars.names;
    r.variables = variables;
    r.constraints = length(constraints);

    const auto& first = best_recorder.get_best(0);

    if (!first.is_solution())
        r.status = result_status::time_limit_reached;
    else
        r.status = result_status::success;

    r.duration = first.duration;
    r.loop = first.loop;
    r.remaining_constraints = first.remaining_constraints;

    switch (ctx.parameters.storage) {
    case solver_parameters::storage_type::one: {
        r.solutions.resize(1);
        convert(first, r.solutions[0], variables);
    } break;

    case solver_parameters::storage_type::bound: {
        r.solutions.resize(2);

        convert(first, r.solutions[0], variables);
        convert(best_recorder.get_worst(), r.solutions[1], variables);
    } break;

    case solver_parameters::storage_type::five: {
        r.solutions.resize(5);

        for (int i = 0; i != 5; ++i)
            convert(best_recorder.get_best(i), r.solutions[i], variables);
    } break;
    }

    best_recorder.show_population(ctx);

    if (ctx.finish)
        ctx.finish(r);

    return r;
}